

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxUnicode.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_> *
Jinx::Impl::GetUtf8CharsByRange
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
           *__return_storage_ptr__,String *source,pair<long,_long> *range)

{
  size_t sVar1;
  undefined1 local_50 [8];
  String out;
  char *srcEnd;
  char *srcCurr;
  pair<long,_long> *range_local;
  String *source_local;
  
  if (range->second < range->first) {
    LogWriteLine(Error,"First range index is greater than second");
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
    ::optional(__return_storage_ptr__);
  }
  else {
    srcEnd = GetUtf8CstrByIndex(source,range->first);
    out.field_2._8_8_ = GetUtf8CstrByIndex(source,range->second);
    if ((srcEnd == (char *)0x0) || ((char *)out.field_2._8_8_ == (char *)0x0)) {
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>::
      optional(__return_storage_ptr__);
    }
    else {
      sVar1 = GetUtf8CharSize((char *)out.field_2._8_8_);
      out.field_2._8_8_ = out.field_2._8_8_ + sVar1;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::basic_string
                ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_50);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::reserve
                ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_50,
                 (range->second - range->first) + 1);
      for (; srcEnd < (ulong)out.field_2._8_8_; srcEnd = srcEnd + 1) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_50,
                   *srcEnd);
      }
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_true>
                (__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_50);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
      ~basic_string((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_50);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline_t std::optional<String> GetUtf8CharsByRange(const String & source, const std::pair<int64_t, int64_t> & range)
	{
		if (range.first > range.second)
		{
			LogWriteLine(LogLevel::Error, "First range index is greater than second");
			return std::optional<String>();
		}
		const char * srcCurr = GetUtf8CstrByIndex(source, range.first);
		const char * srcEnd = GetUtf8CstrByIndex(source, range.second);
		if (srcCurr == nullptr || srcEnd == nullptr)
			return std::optional<String>();
		srcEnd += GetUtf8CharSize(srcEnd);
		String out;
		out.reserve(range.second - range.first + 1);
		while (srcCurr < srcEnd)
		{
			out += *srcCurr;
			++srcCurr;
		}
		return out;
	}